

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

bool __thiscall Js::DynamicObject::TryCopy(DynamicObject *this,DynamicObject *from)

{
  ushort uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  ArrayObject *objArray;
  char16_t *form;
  ulong dstCount;
  
  if (((((((((from->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr)->TTDShouldPerformRecordOrReplayAction !=
        false) || (bVar4 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ObjectCopyPhase), bVar4)) ||
     (bVar4 = IsCompatibleForCopy(this,from), !bVar4)) {
    return false;
  }
  bVar4 = DynamicType::ShareType((DynamicType *)(from->super_RecyclableObject).type.ptr);
  if (bVar4) {
    ReplaceType(this,(DynamicType *)(from->super_RecyclableObject).type.ptr);
    InitSlots(this,this);
    lVar2 = *(long *)((this->super_RecyclableObject).type.ptr + 1);
    uVar1 = *(ushort *)(lVar2 + 0x12);
    dstCount = (ulong)uVar1;
    uVar6 = *(int *)(lVar2 + 0xc) - (uint)uVar1;
    if (0 < (int)uVar6) {
      Memory::
      CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                (&this->auxSlots,(ulong)uVar6,&from->auxSlots,(ulong)uVar6);
    }
    if (dstCount != 0) {
      Memory::
      CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                ((WriteBarrierPtr<void> *)
                 ((long)&(this->super_RecyclableObject).super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                 (ulong)*(ushort *)(*(long *)((this->super_RecyclableObject).type.ptr + 1) + 10)),
                 dstCount,(WriteBarrierPtr<void> *)
                          ((long)&(from->super_RecyclableObject).super_FinalizableObject.
                                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                          (ulong)*(ushort *)
                                  (*(long *)((from->super_RecyclableObject).type.ptr + 1) + 10)),
                 dstCount);
    }
    bVar5 = HasObjectArray(from);
    if (bVar5) {
      bVar5 = HasObjectArray(this);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                    ,0x3ca,"(!this->HasObjectArray())","!this->HasObjectArray()");
        if (!bVar5) goto LAB_00c3ad9b;
        *puVar7 = 0;
      }
      bVar5 = IsObjectHeaderInlinedTypeHandler(this);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                    ,0x3cb,"(!this->IsObjectHeaderInlinedTypeHandler())",
                                    "!this->IsObjectHeaderInlinedTypeHandler()");
        if (!bVar5) {
LAB_00c3ad9b:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      objArray = JavascriptArray::DeepCopyInstance((ArrayObject *)from->field_1);
      SetObjectArray(this,objArray);
    }
    bVar5 = Phases::IsEnabled((Phases *)&DAT_01453738,ObjectCopyPhase);
    if (!bVar5) {
      return true;
    }
    form = L"ObjectCopy succeeded\n";
  }
  else {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_01453738,ObjectCopyPhase);
    if (!bVar5) {
      return false;
    }
    form = L"ObjectCopy: Can\'t copy: failed to share type\n";
  }
  Output::Print(form);
  return bVar4;
}

Assistant:

bool DynamicObject::TryCopy(DynamicObject* from)
    {
#if ENABLE_TTD
        if (from->GetScriptContext()->ShouldPerformRecordOrReplayAction())
        {
            return false;
        }
#endif

        if (PHASE_OFF1(ObjectCopyPhase))
        {
            return false;
        }
        // Validate that objects are compatible
        if (!this->IsCompatibleForCopy(from))
        {
            return false;
        }
        // Share the type
        // Note: this will mark type as shared in case of success
        if (!from->GetDynamicType()->ShareType())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: failed to share type\n"));
            }
            return false;
        }

        // Update this object
        this->ReplaceType(from->GetDynamicType());
        this->InitSlots(this);
        const int slotCapacity = this->GetTypeHandler()->GetSlotCapacity();
        const uint16 inlineSlotCapacity = this->GetTypeHandler()->GetInlineSlotCapacity();
        const int auxSlotCapacity = slotCapacity - inlineSlotCapacity;

        if (auxSlotCapacity > 0)
        {
            CopyArray(this->auxSlots, auxSlotCapacity, from->auxSlots, auxSlotCapacity);
        }
        if (inlineSlotCapacity != 0)
        {
            Field(Var)* thisInlineSlots = this->GetInlineSlots();
            Field(Var)* fromInlineSlots = from->GetInlineSlots();

            CopyArray(thisInlineSlots, inlineSlotCapacity, fromInlineSlots, inlineSlotCapacity);
        }
        if (from->HasObjectArray())
        {
            Assert(!this->HasObjectArray());
            Assert(!this->IsObjectHeaderInlinedTypeHandler());
            this->SetObjectArray(JavascriptArray::DeepCopyInstance(from->GetObjectArrayOrFlagsAsArray()));
        }
        if (PHASE_TRACE1(ObjectCopyPhase))
        {
            Output::Print(_u("ObjectCopy succeeded\n"));
        }

        return true;
    }